

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::Array
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,KeyVal *p,int n)

{
  int local_20;
  int i;
  int n_local;
  KeyVal *p_local;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this_local;
  
  alloc(this,n);
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    Map<asl::String,_asl::Dic<asl::String>_>::KeyVal::operator=(this->_a + local_20,p + local_20);
  }
  return;
}

Assistant:

ASL_EXPLICIT Array(const T* p, int n) { alloc(n); for (int i = 0; i < n; i++) _a[i] = p[i]; }